

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O0

void helicsAppFree(HelicsApp app)

{
  AppObject *pAVar1;
  AppObject *appObj;
  int in_stack_0000005c;
  MasterObjectHolder *in_stack_00000060;
  HelicsError *in_stack_ffffffffffffffd0;
  HelicsApp in_stack_ffffffffffffffd8;
  
  pAVar1 = helics::getAppObject(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (pAVar1 != (AppObject *)0x0) {
    pAVar1->valid = 0;
    getMasterHolder();
    std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f6a47);
    MasterObjectHolder::clearApp(in_stack_00000060,in_stack_0000005c);
    std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x1f6a63);
  }
  helics::CoreFactory::cleanUpCores();
  return;
}

Assistant:

void helicsAppFree(HelicsApp app)
{
    auto* appObj = helics::getAppObject(app, nullptr);
    if (appObj != nullptr) {
        appObj->valid = 0;
        getMasterHolder()->clearApp(appObj->index);
    }

    helics::CoreFactory::cleanUpCores();
}